

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall
phosg::Image::draw_text
          (Image *this,ssize_t x,ssize_t y,uint64_t r,uint64_t g,uint64_t b,uint64_t a,uint64_t br,
          uint64_t bg,uint64_t bb,uint64_t ba,char *fmt,...)

{
  char in_AL;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  __va_list_tag local_d8;
  undefined1 local_b8 [48];
  undefined4 local_88;
  undefined4 local_78;
  undefined4 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Da;
    local_78 = in_XMM1_Da;
    local_68 = in_XMM2_Da;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_d8.reg_save_area = local_b8;
  local_d8.overflow_arg_area = &stack0x00000038;
  local_d8.gp_offset = 0x30;
  local_d8.fp_offset = 0x30;
  draw_text_v(this,x,y,(ssize_t *)0x0,(ssize_t *)0x0,r,g,b,a,br,bg,bb,ba,fmt,&local_d8);
  return;
}

Assistant:

void Image::draw_text(ssize_t x, ssize_t y,
    uint64_t r, uint64_t g, uint64_t b, uint64_t a, uint64_t br, uint64_t bg,
    uint64_t bb, uint64_t ba, const char* fmt, ...) {
  va_list va;
  va_start(va, fmt);
  try {
    this->draw_text_v(x, y, nullptr, nullptr, r, g, b, a, br, bg, bb, ba, fmt, va);
  } catch (...) {
    va_end(va);
    throw;
  }
  va_end(va);
}